

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executionengine.cpp
# Opt level: O1

bool __thiscall
stackjit::ExecutionEngine::loadAssembly
          (ExecutionEngine *this,string *filePath,AssemblyType assemblyType)

{
  char *pcVar1;
  char cVar2;
  long lVar3;
  ostream *poVar4;
  char *pcVar5;
  Assembly assembly;
  ifstream fileStream;
  string local_2a0;
  Assembly local_280;
  ifstream local_230 [520];
  
  lVar3 = std::__cxx11::string::find((char *)filePath,0x179551,0);
  std::ifstream::ifstream(local_230,(string *)filePath,(uint)(lVar3 == -1) * 4 + _S_bin);
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Could not load the assembly \'",0x1d);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(filePath->_M_dataplus)._M_p,
                        filePath->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\'.",2);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
  }
  else if (lVar3 == -1) {
    pcVar5 = "library";
    if (assemblyType == Program) {
      pcVar5 = "program";
    }
    pcVar1 = "library";
    if (assemblyType == Program) {
      pcVar1 = "program";
    }
    local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,pcVar5,pcVar1 + 7);
    Loader::Assembly::Assembly(&local_280,&local_2a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
      operator_delete(local_2a0._M_dataplus._M_p);
    }
    Loader::load((istream *)local_230,&local_280);
    loadAssembly(this,&local_280,assemblyType);
    std::vector<stackjit::Loader::Class,_std::allocator<stackjit::Loader::Class>_>::~vector
              (&local_280.mClasses);
    std::vector<stackjit::Loader::Function,_std::allocator<stackjit::Loader::Function>_>::~vector
              (&local_280.mFunctions);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280.mName._M_dataplus._M_p != &local_280.mName.field_2) {
      operator_delete(local_280.mName._M_dataplus._M_p);
    }
  }
  else {
    loadImage(this,local_230,assemblyType);
  }
  std::ifstream::~ifstream(local_230);
  return (bool)cVar2;
}

Assistant:

bool ExecutionEngine::loadAssembly(std::string filePath, AssemblyType assemblyType) {
		std::ios::openmode openMode = std::ios::in;

		if (filePath.find(".simg") != std::string::npos) {
			openMode = std::ios::binary;
		}

		std::ifstream fileStream(filePath, openMode);

		if (!fileStream.is_open()) {
			std::cout << "Could not load the assembly '" << filePath << "'." << std::endl;
			return false;
		}

		if (openMode == std::ios::binary) {
			loadImage(fileStream, assemblyType);
		} else {
			Loader::Assembly assembly(assemblyType == AssemblyType::Program ? "program": "library");
			Loader::load(fileStream, assembly);
			loadAssembly(assembly, assemblyType);
		}

		return true;
	}